

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool __thiscall deqp::gls::DrawTestSpec::AttributeSpec::valid(AttributeSpec *this,ApiType ctxType)

{
  ApiType other;
  Profile PVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool outputTypeUnsignedInteger;
  bool outputTypeSignedInteger;
  bool outputTypeFloat;
  bool inputTypePacked;
  bool inputTypeSignedInteger;
  bool inputTypeUnsignedInteger;
  bool inputTypeFloat;
  AttributeSpec *this_local;
  ApiType ctxType_local;
  
  bVar3 = true;
  if ((this->inputType != INPUTTYPE_FLOAT) && (bVar3 = true, this->inputType != INPUTTYPE_FIXED)) {
    bVar3 = this->inputType == INPUTTYPE_HALF;
  }
  bVar4 = true;
  if (((this->inputType != INPUTTYPE_UNSIGNED_BYTE) &&
      (bVar4 = true, this->inputType != INPUTTYPE_UNSIGNED_SHORT)) &&
     (bVar4 = true, this->inputType != INPUTTYPE_UNSIGNED_INT)) {
    bVar4 = this->inputType == INPUTTYPE_UNSIGNED_INT_2_10_10_10;
  }
  bVar5 = true;
  if (((this->inputType != INPUTTYPE_BYTE) && (bVar5 = true, this->inputType != INPUTTYPE_SHORT)) &&
     (bVar5 = true, this->inputType != INPUTTYPE_INT)) {
    bVar5 = this->inputType == INPUTTYPE_INT_2_10_10_10;
  }
  bVar6 = true;
  if (this->inputType != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
    bVar6 = this->inputType == INPUTTYPE_INT_2_10_10_10;
  }
  bVar7 = true;
  if (((this->outputType != OUTPUTTYPE_FLOAT) && (bVar7 = true, this->outputType != OUTPUTTYPE_VEC2)
      ) && (bVar7 = true, this->outputType != OUTPUTTYPE_VEC3)) {
    bVar7 = this->outputType == OUTPUTTYPE_VEC4;
  }
  bVar8 = true;
  if (((this->outputType != OUTPUTTYPE_INT) && (bVar8 = true, this->outputType != OUTPUTTYPE_IVEC2))
     && (bVar8 = true, this->outputType != OUTPUTTYPE_IVEC3)) {
    bVar8 = this->outputType == OUTPUTTYPE_IVEC4;
  }
  bVar9 = true;
  if (((this->outputType != OUTPUTTYPE_UINT) && (bVar9 = true, this->outputType != OUTPUTTYPE_UVEC2)
      ) && (bVar9 = true, this->outputType != OUTPUTTYPE_UVEC3)) {
    bVar9 = this->outputType == OUTPUTTYPE_UVEC4;
  }
  if ((this->useDefaultAttribute & 1U) != 0) {
    if (((this->inputType != INPUTTYPE_INT) && (this->inputType != INPUTTYPE_UNSIGNED_INT)) &&
       (this->inputType != INPUTTYPE_FLOAT)) {
      return false;
    }
    if ((this->inputType != INPUTTYPE_FLOAT) && (this->componentCount != 4)) {
      return false;
    }
    if ((this->inputType == INPUTTYPE_INT) && (!bVar8)) {
      return false;
    }
    if ((this->inputType == INPUTTYPE_UNSIGNED_INT) && (!bVar9)) {
      return false;
    }
  }
  if ((bVar6) && (this->componentCount != 4)) {
    this_local._7_1_ = false;
  }
  else if ((!bVar3) || (bVar7)) {
    if ((bVar4) && (bVar8)) {
      this_local._7_1_ = false;
    }
    else if ((bVar5) && (bVar9)) {
      this_local._7_1_ = false;
    }
    else if ((!bVar6) || (bVar7)) {
      if (((this->normalize & 1U) == 0) || (bVar7)) {
        if (((this->bgraComponentOrder & 1U) == 0) || (this->componentCount == 4)) {
          if (((this->bgraComponentOrder & 1U) == 0) ||
             (((this->inputType == INPUTTYPE_UNSIGNED_INT_2_10_10_10 ||
               (this->inputType == INPUTTYPE_INT_2_10_10_10)) ||
              (this->inputType == INPUTTYPE_UNSIGNED_BYTE)))) {
            if (((this->bgraComponentOrder & 1U) == 0) || ((this->normalize & 1U) == 1)) {
              this_local._0_4_ = ctxType.m_bits;
              other = glu::ApiType::es(2,0);
              bVar3 = glu::ApiType::operator==((ApiType *)&this_local,other);
              if (bVar3) {
                if (((this->inputType != INPUTTYPE_FLOAT) && (this->inputType != INPUTTYPE_FIXED))
                   && ((this->inputType != INPUTTYPE_BYTE &&
                       (((this->inputType != INPUTTYPE_UNSIGNED_BYTE &&
                         (this->inputType != INPUTTYPE_SHORT)) &&
                        (this->inputType != INPUTTYPE_UNSIGNED_SHORT)))))) {
                  return false;
                }
                if (!bVar7) {
                  return false;
                }
                if ((this->bgraComponentOrder & 1U) != 0) {
                  return false;
                }
              }
              PVar1 = glu::ApiType::getProfile((ApiType *)&this_local);
              if (((PVar1 == PROFILE_ES) &&
                  (iVar2 = glu::ApiType::getMajorVersion((ApiType *)&this_local), iVar2 == 3)) &&
                 ((this->bgraComponentOrder & 1U) != 0)) {
                this_local._7_1_ = false;
              }
              else {
                PVar1 = glu::ApiType::getProfile((ApiType *)&this_local);
                if (((PVar1 == PROFILE_CORE) && ((this->useDefaultAttribute & 1U) == 0)) &&
                   (this->storage == STORAGE_USER)) {
                  this_local._7_1_ = false;
                }
                else {
                  this_local._7_1_ = true;
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DrawTestSpec::AttributeSpec::valid (glu::ApiType ctxType) const
{
	const bool inputTypeFloat				= inputType == DrawTestSpec::INPUTTYPE_FLOAT || inputType  == DrawTestSpec::INPUTTYPE_FIXED || inputType == DrawTestSpec::INPUTTYPE_HALF;
	const bool inputTypeUnsignedInteger		= inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE || inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT || inputType  == DrawTestSpec::INPUTTYPE_UNSIGNED_INT || inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10;
	const bool inputTypeSignedInteger		= inputType == DrawTestSpec::INPUTTYPE_BYTE  || inputType == DrawTestSpec::INPUTTYPE_SHORT || inputType == DrawTestSpec::INPUTTYPE_INT || inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10;
	const bool inputTypePacked				= inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10;

	const bool outputTypeFloat				= outputType == DrawTestSpec::OUTPUTTYPE_FLOAT || outputType == DrawTestSpec::OUTPUTTYPE_VEC2  || outputType == DrawTestSpec::OUTPUTTYPE_VEC3  || outputType == DrawTestSpec::OUTPUTTYPE_VEC4;
	const bool outputTypeSignedInteger		= outputType == DrawTestSpec::OUTPUTTYPE_INT   || outputType == DrawTestSpec::OUTPUTTYPE_IVEC2 || outputType == DrawTestSpec::OUTPUTTYPE_IVEC3 || outputType == DrawTestSpec::OUTPUTTYPE_IVEC4;
	const bool outputTypeUnsignedInteger	= outputType == DrawTestSpec::OUTPUTTYPE_UINT  || outputType == DrawTestSpec::OUTPUTTYPE_UVEC2 || outputType == DrawTestSpec::OUTPUTTYPE_UVEC3 || outputType == DrawTestSpec::OUTPUTTYPE_UVEC4;

	if (useDefaultAttribute)
	{
		if (inputType != DrawTestSpec::INPUTTYPE_INT && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_INT && inputType != DrawTestSpec::INPUTTYPE_FLOAT)
			return false;

		if (inputType != DrawTestSpec::INPUTTYPE_FLOAT && componentCount != 4)
			return false;

		// no casting allowed (undefined results)
		if (inputType == DrawTestSpec::INPUTTYPE_INT && !outputTypeSignedInteger)
			return false;
		if (inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT && !outputTypeUnsignedInteger)
			return false;
	}

	if (inputTypePacked && componentCount != 4)
		return false;

	// Invalid conversions:

	// float -> [u]int
	if (inputTypeFloat && !outputTypeFloat)
		return false;

	// uint -> int		(undefined results)
	if (inputTypeUnsignedInteger && outputTypeSignedInteger)
		return false;

	// int -> uint		(undefined results)
	if (inputTypeSignedInteger && outputTypeUnsignedInteger)
		return false;

	// packed -> non-float (packed formats are converted to floats)
	if (inputTypePacked && !outputTypeFloat)
		return false;

	// Invalid normalize. Normalize is only valid if output type is float
	if (normalize && !outputTypeFloat)
		return false;

	// Allow reverse order (GL_BGRA) only for packed and 4-component ubyte
	if (bgraComponentOrder && componentCount != 4)
		return false;
	if (bgraComponentOrder && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && inputType != DrawTestSpec::INPUTTYPE_INT_2_10_10_10 && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE)
		return false;
	if (bgraComponentOrder && normalize != true)
		return false;

	// GLES2 limits
	if (ctxType == glu::ApiType::es(2,0))
	{
		if (inputType != DrawTestSpec::INPUTTYPE_FLOAT && inputType != DrawTestSpec::INPUTTYPE_FIXED &&
			inputType != DrawTestSpec::INPUTTYPE_BYTE  && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE &&
			inputType != DrawTestSpec::INPUTTYPE_SHORT && inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT)
			return false;

		if (!outputTypeFloat)
			return false;

		if (bgraComponentOrder)
			return false;
	}

	// GLES3 limits
	if (ctxType.getProfile() == glu::PROFILE_ES && ctxType.getMajorVersion() == 3)
	{
		if (bgraComponentOrder)
			return false;
	}

	// No user pointers in GL core
	if (ctxType.getProfile() == glu::PROFILE_CORE)
	{
		if (!useDefaultAttribute && storage == DrawTestSpec::STORAGE_USER)
			return false;
	}

	return true;
}